

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O1

FunctionArgument * __thiscall
ninx::parser::element::FunctionArgument::clone_impl(FunctionArgument *this)

{
  pointer pcVar1;
  FunctionArgument *pFVar2;
  Expression *local_20;
  
  if ((this->default_value)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
      .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl ==
      (Expression *)0x0) {
    local_20 = (Expression *)0x0;
  }
  else {
    ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_20);
  }
  pFVar2 = (FunctionArgument *)operator_new(0x40);
  (pFVar2->super_ASTElement).parent = (Block *)0x0;
  (pFVar2->super_ASTElement).__output_block = (Block *)0x0;
  (pFVar2->super_ASTElement)._vptr_ASTElement = (_func_int **)&PTR__FunctionArgument_00206fe0;
  (pFVar2->name)._M_dataplus._M_p = (pointer)&(pFVar2->name).field_2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar2->name,pcVar1,pcVar1 + (this->name)._M_string_length);
  (pFVar2->default_value)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl = local_20;
  return pFVar2;
}

Assistant:

ninx::parser::element::FunctionArgument *ninx::parser::element::FunctionArgument::clone_impl() {
    std::unique_ptr<Expression> default_value_copy {nullptr};
    if (this->default_value) {
        default_value_copy = this->default_value->clone<Expression>();
    }

    return new FunctionArgument(this->name, std::move(default_value_copy));
}